

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall
pbrt::
InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::reserve(InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,size_t n)

{
  memory_resource *pmVar1;
  int iVar2;
  undefined4 extraout_var;
  int i;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long lVar5;
  
  if (this->ptr == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    uVar3 = 4;
  }
  else {
    uVar3 = this->nAlloc;
  }
  if (uVar3 < n) {
    pmVar1 = (this->alloc).memoryResource;
    iVar2 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n << 5,8);
    lVar5 = 0;
    for (uVar3 = 0; uVar3 < this->nStored; uVar3 = uVar3 + 1) {
      pbVar4 = this->ptr;
      if (this->ptr == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->field_2
        ;
      }
      std::__cxx11::string::string
                ((string *)
                 ((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(extraout_var,iVar2))->_M_dataplus)._M_p + lVar5),
                 (string *)((long)&pbVar4->_M_dataplus + lVar5));
      pbVar4 = this->ptr;
      if (this->ptr == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->field_2
        ;
      }
      std::__cxx11::string::~string((string *)((long)&pbVar4->_M_dataplus + lVar5));
      lVar5 = lVar5 + 0x20;
    }
    pmVar1 = (this->alloc).memoryResource;
    (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc << 5,8);
    this->nAlloc = n;
    this->ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(extraout_var,iVar2);
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (capacity() >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }